

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.cpp
# Opt level: O0

int __thiscall Event::listen(Event *this,int __fd,int __n)

{
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  Event *pEVar1;
  function<void_(Peer_*)> local_80;
  Callable local_60;
  function<void_(Peer_*)> *local_20;
  function<void_(Peer_*)> *func_local;
  Event *this_local;
  
  pEVar1 = (Event *)CONCAT44(in_register_00000034,__fd);
  local_20 = (function<void_(Peer_*)> *)CONCAT44(in_register_00000014,__n);
  func_local = (function<void_(Peer_*)> *)pEVar1;
  this_local = this;
  std::function<void_(Peer_*)>::function(&local_80,local_20);
  Callable::Callable(&local_60,&local_80);
  std::vector<Callable,_std::allocator<Callable>_>::emplace_back<Callable>
            (&pEVar1->m_listeners,&local_60);
  Callable::~Callable(&local_60);
  std::function<void_(Peer_*)>::~function(&local_80);
  Event(this,pEVar1);
  return (int)this;
}

Assistant:

Event Event::listen(std::function<void(Peer *)> func)
{
    m_listeners.emplace_back(Callable(std::move(func)));
    return *this;
}